

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqdec.c
# Opt level: O3

void jpc_mqdec_dump(jpc_mqdec_t *mqdec,FILE *out)

{
  jpc_mqstate_t *pjVar1;
  
  fprintf((FILE *)out,"MQDEC A = %08lx, C = %08lx, CT=%08lx, ",mqdec->areg,mqdec->creg,mqdec->ctreg)
  ;
  fprintf((FILE *)out,"CTX = %ld, ",(long)mqdec->curctx - (long)mqdec->ctxs >> 3);
  pjVar1 = *mqdec->curctx;
  fprintf((FILE *)out,"IND %ld, MPS %d, QEVAL %lx\n",(long)(pjVar1 + -0xa4f6) >> 5,
          (ulong)pjVar1->mps,pjVar1->qeval);
  return;
}

Assistant:

void jpc_mqdec_dump(const jpc_mqdec_t *mqdec, FILE *out)
{
	fprintf(out, "MQDEC A = %08lx, C = %08lx, CT=%08lx, ",
	  (unsigned long) mqdec->areg, (unsigned long) mqdec->creg,
	  (unsigned long) mqdec->ctreg);
	fprintf(out, "CTX = %" PRIdPTR ", ", mqdec->curctx - mqdec->ctxs);
	fprintf(out, "IND %" PRIdPTR ", MPS %d, QEVAL %"PRIxFAST16"\n", *mqdec->curctx -
	  jpc_mqstates, (*mqdec->curctx)->mps, (*mqdec->curctx)->qeval);
}